

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filereader.cpp
# Opt level: O3

string * getFilenameExt(string *__return_storage_ptr__,string filename)

{
  char *pcVar1;
  string *extraout_RAX;
  string *psVar2;
  long in_RDX;
  long in_RSI;
  string *local_38 [4];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,in_RSI,in_RDX + in_RSI)
  ;
  pcVar1 = (char *)std::__cxx11::string::find_last_of
                             ((char *)__return_storage_ptr__,0x3da317,0xffffffffffffffff);
  if (pcVar1 < (char *)__return_storage_ptr__->_M_string_length) {
    std::__cxx11::string::substr((ulong)local_38,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_38);
    psVar2 = (string *)(local_38 + 2);
    if (local_38[0] != psVar2) {
      operator_delete(local_38[0]);
      psVar2 = extraout_RAX;
    }
  }
  else {
    psVar2 = (string *)
             std::__cxx11::string::_M_replace
                       ((ulong)__return_storage_ptr__,0,
                        (char *)__return_storage_ptr__->_M_string_length,0x3cbf27);
  }
  return psVar2;
}

Assistant:

static const std::string getFilenameExt(const std::string filename) {
  // Extract file name extension
  std::string name = filename;
  std::size_t found = name.find_last_of(".");
  if (found < name.size()) {
    name = name.substr(found + 1);
  } else {
    name = "";
  }
  return name;
}